

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 (*pauVar1) [12];
  undefined1 (*pauVar2) [16];
  float fVar3;
  BBox1f BVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  long lVar8;
  PrimRefMB *pPVar9;
  undefined1 auVar10 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  undefined1 auVar22 [12];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  uint uVar28;
  ulong uVar30;
  int iVar31;
  size_t itime;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  undefined4 uVar39;
  long lVar40;
  float fVar41;
  float fVar56;
  float fVar57;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar58;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar59;
  float fVar67;
  float fVar68;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar76;
  float fVar77;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar89;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  __m128 a;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  float fVar123;
  float fVar124;
  float fVar129;
  float fVar131;
  float fVar133;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar130;
  float fVar132;
  float fVar134;
  undefined1 auVar128 [16];
  float fVar135;
  float fVar136;
  float fVar139;
  float fVar141;
  vfloat4 b1;
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar145 [16];
  float fVar146;
  float fVar150;
  float fVar151;
  vfloat4 b0;
  float fVar152;
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar153 [32];
  vfloat4 b1_2;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  ulong local_440;
  size_t local_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  float local_318;
  float fStack_314;
  float fStack_310;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  ulong local_280;
  undefined1 local_278 [32];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  anon_class_16_2_07cfa4d6 local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong uVar29;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar33 = r->_begin;
  local_338 = SUB6416(ZEXT464(0x3f800000),0);
  local_328 = ZEXT816(0x3f80000000000000);
  local_440 = 0;
  auVar117 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  auVar122 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  local_368._8_4_ = 0xff800000;
  local_368._0_8_ = 0xff800000ff800000;
  local_368._12_4_ = 0xff800000;
  local_378._8_4_ = 0x7f800000;
  local_378._0_8_ = 0x7f8000007f800000;
  local_378._12_4_ = 0x7f800000;
  local_348._8_4_ = 0xff800000;
  local_348._0_8_ = 0xff800000ff800000;
  local_348._12_4_ = 0xff800000;
  local_388._8_4_ = 0xff800000;
  local_388._0_8_ = 0xff800000ff800000;
  local_388._12_4_ = 0xff800000;
  local_358._8_4_ = 0x7f800000;
  local_358._0_8_ = 0x7f8000007f800000;
  local_358._12_4_ = 0x7f800000;
  local_3a8._8_4_ = 0x7f800000;
  local_3a8._0_8_ = 0x7f8000007f800000;
  local_3a8._12_4_ = 0x7f800000;
  local_398 = ZEXT816(0);
  local_410 = k;
  while( true ) {
    if (r->_end <= uVar33) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_3a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_3a8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_388._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_388._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_378._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_378._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_368._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_368._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_358._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_358._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_348._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_348._8_8_;
      (__return_storage_ptr__->object_range)._end = local_398._0_8_;
      __return_storage_ptr__->num_time_segments = local_398._8_8_;
      __return_storage_ptr__->max_num_time_segments = local_440;
      auVar104 = vunpcklpd_avx(local_328,local_338);
      (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar104._0_8_;
      (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar104._0_8_ >> 0x20);
      (__return_storage_ptr__->time_range).lower = (float)(int)auVar104._8_8_;
      (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar104._8_8_ >> 0x20);
      return __return_storage_ptr__;
    }
    BVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar104._8_8_ = 0;
    auVar104._0_4_ = BVar4.lower;
    auVar104._4_4_ = BVar4.upper;
    auVar104 = vmovshdup_avx(auVar104);
    fVar77 = BVar4.lower;
    fVar99 = auVar104._0_4_ - fVar77;
    uVar28 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.field_0x68 * uVar33);
    uVar29 = (ulong)(uVar28 + 3);
    pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    if (uVar29 < (pBVar5->super_RawBufferView).num) break;
LAB_00bea770:
    uVar33 = uVar33 + 1;
  }
  fVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  auVar104 = ZEXT416((uint)(fVar3 * ((t0t1->upper - fVar77) / fVar99) * 0.99999976));
  auVar104 = vroundss_avx(auVar104,auVar104,10);
  auVar104 = vminss_avx(auVar104,ZEXT416((uint)fVar3));
  uVar30 = (ulong)(int)auVar104._0_4_;
  auVar104 = ZEXT416((uint)(fVar3 * ((t0t1->lower - fVar77) / fVar99) * 1.0000002));
  auVar104 = vroundss_avx(auVar104,auVar104,9);
  auVar104 = vmaxss_avx(ZEXT816(0) << 0x40,auVar104);
  pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           normals.items;
  fVar99 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  _fStack_1f0 = bezier_basis0._1640_8_;
  uVar23 = _fStack_1f0;
  _fStack_1e8 = bezier_basis0._1648_8_;
  uVar24 = _fStack_1e8;
  _fStack_1e0 = bezier_basis0._1656_8_;
  uVar25 = _fStack_1e0;
  local_1a8 = (float)bezier_basis0._3944_8_;
  fStack_1a4 = SUB84(bezier_basis0._3944_8_,4);
  fStack_1a0 = (float)bezier_basis0._3952_8_;
  fStack_19c = SUB84(bezier_basis0._3952_8_,4);
  fStack_198 = (float)bezier_basis0._3960_8_;
  fStack_194 = SUB84(bezier_basis0._3960_8_,4);
  fStack_190 = (float)bezier_basis0._3968_8_;
  fStack_18c = SUB84(bezier_basis0._3968_8_,4);
  local_2d8 = (float)bezier_basis0._7412_8_;
  fStack_2d4 = SUB84(bezier_basis0._7412_8_,4);
  fStack_2d0 = (float)bezier_basis0._7420_8_;
  fStack_2cc = SUB84(bezier_basis0._7420_8_,4);
  local_1d8 = (float)bezier_basis0._8568_8_;
  fStack_1d4 = SUB84(bezier_basis0._8568_8_,4);
  fStack_1d0 = (float)bezier_basis0._8576_8_;
  fStack_1cc = SUB84(bezier_basis0._8576_8_,4);
  _fStack_1c8 = bezier_basis0._8584_8_;
  uVar26 = _fStack_1c8;
  _fStack_1c0 = bezier_basis0._8592_8_;
  uVar27 = _fStack_1c0;
  lVar34 = (long)(int)auVar104._0_4_ * 0x38 + 0x10;
  uVar32 = (long)(int)auVar104._0_4_ - 1;
LAB_00be9986:
  uVar32 = uVar32 + 1;
  auVar104 = auVar117._0_16_;
  auVar70 = auVar122._0_16_;
  fStack_1f4 = SUB84(bezier_basis0._1632_8_,4);
  if (uVar30 < uVar32) {
    local_1b8.primID = &local_280;
    fVar99 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             super_Geometry.time_range.lower;
    fVar124 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range.upper - fVar99;
    fVar77 = (t0t1->lower - fVar99) / fVar124;
    fVar124 = (t0t1->upper - fVar99) / fVar124;
    _local_1f8 = CONCAT44(fStack_1f4,fVar77);
    fVar77 = fVar3 * fVar77;
    fVar99 = fVar3 * fVar124;
    auVar96 = vroundss_avx(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77),9);
    auVar102 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),10);
    auVar104 = vmaxss_avx(auVar96,ZEXT816(0));
    auVar70 = vminss_avx(auVar102,ZEXT416((uint)fVar3));
    iVar36 = (int)auVar104._0_4_;
    fVar130 = auVar70._0_4_;
    iVar31 = (int)auVar96._0_4_;
    iVar38 = -1;
    if (-1 < iVar31) {
      iVar38 = iVar31;
    }
    iVar21 = (int)fVar3 + 1;
    if ((int)auVar102._0_4_ < (int)fVar3 + 1) {
      iVar21 = (int)auVar102._0_4_;
    }
    local_280 = uVar33;
    _fStack_1f0 = uVar23;
    _fStack_1e8 = uVar24;
    _fStack_1e0 = uVar25;
    _fStack_1c8 = uVar26;
    _fStack_1c0 = uVar27;
    local_1b8.this = this;
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_1b8,(long)iVar36);
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_1b8,(long)(int)fVar130);
    fVar77 = fVar77 - auVar104._0_4_;
    if (iVar21 - iVar38 == 1) {
      auVar104 = vmaxss_avx(ZEXT416((uint)fVar77),ZEXT816(0) << 0x40);
      auVar70 = vshufps_avx(auVar104,auVar104,0);
      auVar104 = ZEXT416((uint)(1.0 - auVar104._0_4_));
      auVar104 = vshufps_avx(auVar104,auVar104,0);
      auVar128._0_4_ =
           auVar70._0_4_ * bupper1.lower.field_0.m128[0] +
           auVar104._0_4_ * blower0.lower.field_0.m128[0];
      auVar128._4_4_ =
           auVar70._4_4_ * bupper1.lower.field_0.m128[1] +
           auVar104._4_4_ * blower0.lower.field_0.m128[1];
      auVar128._8_4_ =
           auVar70._8_4_ * bupper1.lower.field_0.m128[2] +
           auVar104._8_4_ * blower0.lower.field_0.m128[2];
      auVar128._12_4_ =
           auVar70._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar104._12_4_ * blower0.lower.field_0.m128[3];
      auVar113._0_4_ =
           auVar70._0_4_ * bupper1.upper.field_0.m128[0] +
           auVar104._0_4_ * blower0.upper.field_0.m128[0];
      auVar113._4_4_ =
           auVar70._4_4_ * bupper1.upper.field_0.m128[1] +
           auVar104._4_4_ * blower0.upper.field_0.m128[1];
      auVar113._8_4_ =
           auVar70._8_4_ * bupper1.upper.field_0.m128[2] +
           auVar104._8_4_ * blower0.upper.field_0.m128[2];
      auVar113._12_4_ =
           auVar70._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar104._12_4_ * blower0.upper.field_0.m128[3];
      auVar104 = vmaxss_avx(ZEXT416((uint)(fVar130 - fVar99)),ZEXT816(0) << 0x40);
      auVar70 = vshufps_avx(auVar104,auVar104,0);
      auVar104 = ZEXT416((uint)(1.0 - auVar104._0_4_));
      auVar104 = vshufps_avx(auVar104,auVar104,0);
      auVar96._0_4_ =
           auVar104._0_4_ * bupper1.lower.field_0.m128[0] +
           auVar70._0_4_ * blower0.lower.field_0.m128[0];
      auVar96._4_4_ =
           auVar104._4_4_ * bupper1.lower.field_0.m128[1] +
           auVar70._4_4_ * blower0.lower.field_0.m128[1];
      auVar96._8_4_ =
           auVar104._8_4_ * bupper1.lower.field_0.m128[2] +
           auVar70._8_4_ * blower0.lower.field_0.m128[2];
      auVar96._12_4_ =
           auVar104._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar70._12_4_ * blower0.lower.field_0.m128[3];
      auVar102._0_4_ =
           auVar104._0_4_ * bupper1.upper.field_0.m128[0] +
           auVar70._0_4_ * blower0.upper.field_0.m128[0];
      auVar102._4_4_ =
           auVar104._4_4_ * bupper1.upper.field_0.m128[1] +
           auVar70._4_4_ * blower0.upper.field_0.m128[1];
      auVar102._8_4_ =
           auVar104._8_4_ * bupper1.upper.field_0.m128[2] +
           auVar70._8_4_ * blower0.upper.field_0.m128[2];
      auVar102._12_4_ =
           auVar104._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar70._12_4_ * blower0.upper.field_0.m128[3];
    }
    else {
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_1b8,(long)(iVar36 + 1));
      linearBounds::anon_class_16_2_07cfa4d6::operator()
                (&bupper0,&local_1b8,(long)((int)fVar130 + -1));
      auVar104 = vmaxss_avx(ZEXT416((uint)fVar77),ZEXT816(0) << 0x40);
      auVar70 = vshufps_avx(auVar104,auVar104,0);
      auVar104 = ZEXT416((uint)(1.0 - auVar104._0_4_));
      auVar104 = vshufps_avx(auVar104,auVar104,0);
      auVar128._0_4_ =
           auVar70._0_4_ * blower1.lower.field_0.m128[0] +
           auVar104._0_4_ * blower0.lower.field_0.m128[0];
      auVar128._4_4_ =
           auVar70._4_4_ * blower1.lower.field_0.m128[1] +
           auVar104._4_4_ * blower0.lower.field_0.m128[1];
      auVar128._8_4_ =
           auVar70._8_4_ * blower1.lower.field_0.m128[2] +
           auVar104._8_4_ * blower0.lower.field_0.m128[2];
      auVar128._12_4_ =
           auVar70._12_4_ * blower1.lower.field_0.m128[3] +
           auVar104._12_4_ * blower0.lower.field_0.m128[3];
      auVar113._0_4_ =
           auVar70._0_4_ * blower1.upper.field_0.m128[0] +
           auVar104._0_4_ * blower0.upper.field_0.m128[0];
      auVar113._4_4_ =
           auVar70._4_4_ * blower1.upper.field_0.m128[1] +
           auVar104._4_4_ * blower0.upper.field_0.m128[1];
      auVar113._8_4_ =
           auVar70._8_4_ * blower1.upper.field_0.m128[2] +
           auVar104._8_4_ * blower0.upper.field_0.m128[2];
      auVar113._12_4_ =
           auVar70._12_4_ * blower1.upper.field_0.m128[3] +
           auVar104._12_4_ * blower0.upper.field_0.m128[3];
      auVar104 = vmaxss_avx(ZEXT416((uint)(fVar130 - fVar99)),ZEXT816(0) << 0x40);
      auVar70 = vshufps_avx(auVar104,auVar104,0);
      auVar104 = ZEXT416((uint)(1.0 - auVar104._0_4_));
      auVar104 = vshufps_avx(auVar104,auVar104,0);
      auVar96._0_4_ =
           auVar70._0_4_ * bupper0.lower.field_0.m128[0] +
           auVar104._0_4_ * bupper1.lower.field_0.m128[0];
      auVar96._4_4_ =
           auVar70._4_4_ * bupper0.lower.field_0.m128[1] +
           auVar104._4_4_ * bupper1.lower.field_0.m128[1];
      auVar96._8_4_ =
           auVar70._8_4_ * bupper0.lower.field_0.m128[2] +
           auVar104._8_4_ * bupper1.lower.field_0.m128[2];
      auVar96._12_4_ =
           auVar70._12_4_ * bupper0.lower.field_0.m128[3] +
           auVar104._12_4_ * bupper1.lower.field_0.m128[3];
      auVar102._0_4_ =
           auVar70._0_4_ * bupper0.upper.field_0.m128[0] +
           auVar104._0_4_ * bupper1.upper.field_0.m128[0];
      auVar102._4_4_ =
           auVar70._4_4_ * bupper0.upper.field_0.m128[1] +
           auVar104._4_4_ * bupper1.upper.field_0.m128[1];
      auVar102._8_4_ =
           auVar70._8_4_ * bupper0.upper.field_0.m128[2] +
           auVar104._8_4_ * bupper1.upper.field_0.m128[2];
      auVar102._12_4_ =
           auVar70._12_4_ * bupper0.upper.field_0.m128[3] +
           auVar104._12_4_ * bupper1.upper.field_0.m128[3];
      if (iVar31 < 0) {
        iVar31 = -1;
      }
      local_1a8 = fVar124 - local_1f8;
      itime = (size_t)iVar31;
      while (itime = itime + 1, (long)itime < (long)iVar21) {
        auVar50._0_4_ = ((float)(int)itime / fVar3 - local_1f8) / local_1a8;
        auVar50._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar104 = vshufps_avx(auVar50,auVar50,0);
        fVar99 = auVar96._4_4_;
        fVar77 = auVar96._8_4_;
        fVar124 = auVar96._12_4_;
        auVar70 = vshufps_avx(ZEXT416((uint)(1.0 - auVar50._0_4_)),
                              ZEXT416((uint)(1.0 - auVar50._0_4_)),0);
        fVar58 = auVar128._4_4_;
        fVar59 = auVar128._8_4_;
        fVar67 = auVar128._12_4_;
        fVar130 = auVar102._4_4_;
        fVar132 = auVar102._8_4_;
        fVar134 = auVar102._12_4_;
        fVar41 = auVar113._4_4_;
        fVar56 = auVar113._8_4_;
        fVar57 = auVar113._12_4_;
        local_1d8 = auVar102._0_4_ * auVar104._0_4_ + auVar113._0_4_ * auVar70._0_4_;
        fStack_1d4 = fVar130 * auVar104._4_4_ + fVar41 * auVar70._4_4_;
        fStack_1d0 = fVar132 * auVar104._8_4_ + fVar56 * auVar70._8_4_;
        fStack_1cc = fVar134 * auVar104._12_4_ + fVar57 * auVar70._12_4_;
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_1b8,itime);
        auVar10._4_4_ = fVar99 * auVar104._4_4_ + fVar58 * auVar70._4_4_;
        auVar10._0_4_ = auVar96._0_4_ * auVar104._0_4_ + auVar128._0_4_ * auVar70._0_4_;
        auVar10._8_4_ = fVar77 * auVar104._8_4_ + fVar59 * auVar70._8_4_;
        auVar10._12_4_ = fVar124 * auVar104._12_4_ + fVar67 * auVar70._12_4_;
        auVar104 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar10);
        auVar70._4_4_ = fStack_1d4;
        auVar70._0_4_ = local_1d8;
        auVar70._8_4_ = fStack_1d0;
        auVar70._12_4_ = fStack_1cc;
        auVar10 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar70);
        auVar70 = vminps_avx(auVar104,ZEXT816(0) << 0x40);
        auVar104 = vmaxps_avx(auVar10,ZEXT816(0) << 0x40);
        auVar128._0_4_ = auVar128._0_4_ + auVar70._0_4_;
        auVar128._4_4_ = fVar58 + auVar70._4_4_;
        auVar128._8_4_ = fVar59 + auVar70._8_4_;
        auVar128._12_4_ = fVar67 + auVar70._12_4_;
        auVar96._0_4_ = auVar96._0_4_ + auVar70._0_4_;
        auVar96._4_4_ = fVar99 + auVar70._4_4_;
        auVar96._8_4_ = fVar77 + auVar70._8_4_;
        auVar96._12_4_ = fVar124 + auVar70._12_4_;
        auVar113._0_4_ = auVar113._0_4_ + auVar104._0_4_;
        auVar113._4_4_ = fVar41 + auVar104._4_4_;
        auVar113._8_4_ = fVar56 + auVar104._8_4_;
        auVar113._12_4_ = fVar57 + auVar104._12_4_;
        auVar102._0_4_ = auVar102._0_4_ + auVar104._0_4_;
        auVar102._4_4_ = fVar130 + auVar104._4_4_;
        auVar102._8_4_ = fVar132 + auVar104._8_4_;
        auVar102._12_4_ = fVar134 + auVar104._12_4_;
      }
    }
    aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar128,ZEXT416(geomID),0x30);
    uVar28 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             super_Geometry.numTimeSteps - 1;
    uVar29 = (ulong)uVar28;
    BVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar49._8_8_ = 0;
    auVar49._0_4_ = BVar4.lower;
    auVar49._4_4_ = BVar4.upper;
    aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar113,ZEXT416((uint)uVar33),0x30);
    aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar96,ZEXT416(uVar28),0x30);
    aVar14 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar102,ZEXT416(uVar28),0x30);
    auVar70 = vcmpps_avx(local_338,auVar49,1);
    auVar96 = vinsertps_avx(local_338,auVar49,0x50);
    auVar104 = vblendps_avx(auVar49,local_338,2);
    local_338 = vblendvps_avx(auVar104,auVar96,auVar70);
    auVar103._0_4_ = aVar11.x * 0.5 + aVar13.x * 0.5 + aVar12.x * 0.5 + aVar14.x * 0.5;
    auVar103._4_4_ = aVar11.y * 0.5 + aVar13.y * 0.5 + aVar12.y * 0.5 + aVar14.y * 0.5;
    auVar103._8_4_ = aVar11.z * 0.5 + aVar13.z * 0.5 + aVar12.z * 0.5 + aVar14.z * 0.5;
    auVar103._12_4_ =
         aVar11.field_3.w * 0.5 + aVar13.field_3.w * 0.5 +
         aVar12.field_3.w * 0.5 + aVar14.field_3.w * 0.5;
    local_358 = vminps_avx(local_358,auVar103);
    local_348 = vmaxps_avx(local_348,auVar103);
    auVar104 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar30 >> 8),local_440 < uVar29)),0x50);
    auVar104 = vpslld_avx(auVar104,0x1f);
    local_328 = vblendvps_avx(local_328,auVar49,auVar104);
    auVar104 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar104 = vpinsrq_avx(auVar104,uVar29,1);
    local_398 = vpaddq_avx(local_398,auVar104);
    if (local_440 <= uVar29) {
      local_440 = uVar29;
    }
    local_3a8 = vminps_avx(local_3a8,(undefined1  [16])aVar11);
    pPVar9 = prims->items;
    pPVar9[local_410].lbounds.bounds0.lower.field_0.field_1 = aVar11;
    local_388 = vmaxps_avx(local_388,(undefined1  [16])aVar12);
    pPVar9[local_410].lbounds.bounds0.upper.field_0.field_1 = aVar12;
    local_378 = vminps_avx(local_378,(undefined1  [16])aVar13);
    pPVar9[local_410].lbounds.bounds1.lower.field_0.field_1 = aVar13;
    local_368 = vmaxps_avx(local_368,(undefined1  [16])aVar14);
    pPVar9[local_410].lbounds.bounds1.upper.field_0.field_1 = aVar14;
    pPVar9[local_410].time_range = BVar4;
    local_410 = local_410 + 1;
    auVar117 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar122 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  }
  else {
    lVar7 = *(long *)((long)pBVar5 + lVar34 + -0x10);
    lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar34);
    lVar40 = lVar8 * (ulong)uVar28;
    lVar37 = lVar8 * (ulong)(uVar28 + 1);
    lVar35 = lVar8 * (ulong)(uVar28 + 2);
    auVar96 = vinsertps_avx(ZEXT416(*(uint *)(lVar7 + 0xc + lVar40)),
                            ZEXT416(*(uint *)(lVar7 + 0xc + lVar37)),0x10);
    auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(lVar7 + 0xc + lVar35)),0x20);
    auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar29)),0x30);
    auVar60._8_4_ = 0x7fffffff;
    auVar60._0_8_ = 0x7fffffff7fffffff;
    auVar60._12_4_ = 0x7fffffff;
    auVar96 = vandps_avx(auVar96,auVar60);
    auVar96 = vcmpps_avx(auVar96,auVar104,5);
    if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar96 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar96 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar96[0xf]) {
      auVar96 = *(undefined1 (*) [16])(lVar7 + lVar40);
      auVar102 = vcmpps_avx(auVar96,auVar70,6);
      auVar113 = vcmpps_avx(auVar96,auVar104,1);
      auVar102 = vandps_avx(auVar102,auVar113);
      uVar39 = vmovmskps_avx(auVar102);
      if ((~(byte)uVar39 & 7) == 0) {
        auVar102 = *(undefined1 (*) [16])(lVar7 + lVar37);
        auVar113 = vcmpps_avx(auVar102,auVar70,6);
        auVar128 = vcmpps_avx(auVar102,auVar104,1);
        auVar113 = vandps_avx(auVar113,auVar128);
        uVar39 = vmovmskps_avx(auVar113);
        if ((~(byte)uVar39 & 7) == 0) {
          auVar113 = *(undefined1 (*) [16])(lVar7 + lVar35);
          auVar128 = vcmpps_avx(auVar113,auVar70,6);
          auVar10 = vcmpps_avx(auVar113,auVar104,1);
          auVar128 = vandps_avx(auVar128,auVar10);
          uVar39 = vmovmskps_avx(auVar128);
          if ((~(byte)uVar39 & 7) == 0) {
            auVar128 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar29);
            auVar10 = vcmpps_avx(auVar128,auVar70,6);
            auVar50 = vcmpps_avx(auVar128,auVar104,1);
            auVar10 = vandps_avx(auVar10,auVar50);
            uVar39 = vmovmskps_avx(auVar10);
            if ((~(byte)uVar39 & 7) == 0) {
              lVar7 = *(long *)((long)pBVar6 + lVar34 + -0x10);
              lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar34);
              auVar10 = *(undefined1 (*) [16])(lVar7 + lVar8 * (ulong)uVar28);
              auVar50 = vcmpps_avx(auVar10,auVar70,6);
              auVar49 = vcmpps_avx(auVar10,auVar104,1);
              auVar50 = vandps_avx(auVar50,auVar49);
              uVar39 = vmovmskps_avx(auVar50);
              if ((~(byte)uVar39 & 7) == 0) {
                auVar50 = *(undefined1 (*) [16])(lVar7 + lVar8 * (ulong)(uVar28 + 1));
                auVar70 = vcmpps_avx(auVar50,auVar70,6);
                auVar104 = vcmpps_avx(auVar50,auVar104,1);
                auVar104 = vandps_avx(auVar70,auVar104);
                uVar39 = vmovmskps_avx(auVar104);
                if ((~(byte)uVar39 & 7) == 0) goto code_r0x00be9af8;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_00bea770;
code_r0x00be9af8:
  auVar104 = vshufps_avx(auVar96,auVar96,0xff);
  auVar104 = vinsertps_avx(auVar96,ZEXT416((uint)(auVar104._0_4_ * fVar99)),0x30);
  auVar70 = vshufps_avx(auVar102,auVar102,0xff);
  auVar70 = vinsertps_avx(auVar102,ZEXT416((uint)(auVar70._0_4_ * fVar99)),0x30);
  auVar96 = vshufps_avx(auVar113,auVar113,0xff);
  auVar96 = vinsertps_avx(auVar113,ZEXT416((uint)(auVar96._0_4_ * fVar99)),0x30);
  auVar102 = vshufps_avx(auVar128,auVar128,0xff);
  auVar102 = vinsertps_avx(auVar128,ZEXT416((uint)(auVar102._0_4_ * fVar99)),0x30);
  fVar123 = auVar10._0_4_;
  fVar129 = auVar10._4_4_;
  fVar131 = auVar10._8_4_;
  fVar133 = auVar10._12_4_;
  pauVar1 = (undefined1 (*) [12])(lVar7 + lVar8 * (ulong)(uVar28 + 2));
  auVar22 = *pauVar1;
  fVar134 = *(float *)pauVar1[1];
  fVar59 = *(float *)*pauVar1 * 0.0;
  fVar67 = *(float *)(*pauVar1 + 4) * 0.0;
  fVar68 = *(float *)(*pauVar1 + 8) * 0.0;
  pauVar2 = (undefined1 (*) [16])(lVar7 + lVar8 * uVar29);
  auVar10 = *pauVar2;
  fVar135 = *(float *)*pauVar2 * -0.0;
  fVar139 = *(float *)(*pauVar2 + 4) * -0.0;
  fVar141 = *(float *)(*pauVar2 + 8) * -0.0;
  fVar143 = *(float *)(*pauVar2 + 0xc) * -0.0;
  fVar89 = auVar50._0_4_;
  fVar98 = auVar50._4_4_;
  fVar100 = auVar50._8_4_;
  fVar101 = auVar50._12_4_;
  auVar42._0_4_ = fVar123 * -0.0 + fVar89 + fVar135 + fVar59;
  auVar42._4_4_ = fVar129 * -0.0 + fVar98 + fVar139 + fVar67;
  auVar42._8_4_ = fVar131 * -0.0 + fVar100 + fVar141 + fVar68;
  auVar42._12_4_ = fVar133 * -0.0 + fVar101 + fVar143 + fVar134 * 0.0;
  fVar76 = auVar70._0_4_;
  fVar86 = auVar70._4_4_;
  fVar87 = auVar70._8_4_;
  fVar88 = auVar70._12_4_;
  fVar146 = auVar96._0_4_;
  fVar150 = auVar96._4_4_;
  fVar151 = auVar96._8_4_;
  fVar152 = auVar96._12_4_;
  fVar105 = auVar102._0_4_;
  fVar110 = auVar102._4_4_;
  fVar111 = auVar102._8_4_;
  fVar112 = auVar102._12_4_;
  auVar61._0_4_ = fVar76 * 0.0 + fVar146 * 0.5 + fVar105 * 0.0;
  auVar61._4_4_ = fVar86 * 0.0 + fVar150 * 0.5 + fVar110 * 0.0;
  auVar61._8_4_ = fVar87 * 0.0 + fVar151 * 0.5 + fVar111 * 0.0;
  auVar61._12_4_ = fVar88 * 0.0 + fVar152 * 0.5 + fVar112 * 0.0;
  fVar77 = auVar104._0_4_;
  auVar69._0_4_ = fVar77 * 0.5;
  fVar124 = auVar104._4_4_;
  auVar69._4_4_ = fVar124 * 0.5;
  fVar130 = auVar104._8_4_;
  auVar69._8_4_ = fVar130 * 0.5;
  fVar132 = auVar104._12_4_;
  auVar69._12_4_ = fVar132 * 0.5;
  auVar128 = vsubps_avx(auVar61,auVar69);
  auVar96 = vshufps_avx(auVar128,auVar128,0xc9);
  auVar62._0_4_ = auVar96._0_4_ * auVar42._0_4_;
  auVar62._4_4_ = auVar96._4_4_ * auVar42._4_4_;
  auVar62._8_4_ = auVar96._8_4_ * auVar42._8_4_;
  auVar62._12_4_ = auVar96._12_4_ * auVar42._12_4_;
  auVar104 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar136 = auVar128._0_4_;
  auVar43._0_4_ = fVar136 * auVar104._0_4_;
  fVar140 = auVar128._4_4_;
  auVar43._4_4_ = fVar140 * auVar104._4_4_;
  fVar142 = auVar128._8_4_;
  auVar43._8_4_ = fVar142 * auVar104._8_4_;
  fVar144 = auVar128._12_4_;
  auVar43._12_4_ = fVar144 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar62,auVar43);
  auVar102 = vshufps_avx(auVar104,auVar104,0xc9);
  auVar104 = vdpps_avx(auVar102,auVar102,0x7f);
  fVar56 = auVar104._0_4_;
  auVar50 = ZEXT416((uint)fVar56);
  auVar70 = vrsqrtss_avx(auVar50,auVar50);
  fVar41 = auVar70._0_4_;
  auVar125._0_4_ = *(float *)*pauVar2 * 0.0 + *(float *)*pauVar1 * 0.5 + fVar89 * 0.0;
  auVar125._4_4_ = *(float *)(*pauVar2 + 4) * 0.0 + *(float *)(*pauVar1 + 4) * 0.5 + fVar98 * 0.0;
  auVar125._8_4_ = *(float *)(*pauVar2 + 8) * 0.0 + *(float *)(*pauVar1 + 8) * 0.5 + fVar100 * 0.0;
  auVar125._12_4_ = *(float *)(*pauVar2 + 0xc) * 0.0 + fVar134 * 0.5 + fVar101 * 0.0;
  auVar106._0_4_ = fVar123 * 0.5;
  auVar106._4_4_ = fVar129 * 0.5;
  auVar106._8_4_ = fVar131 * 0.5;
  auVar106._12_4_ = fVar133 * 0.5;
  auVar70 = vsubps_avx(auVar125,auVar106);
  auVar126._0_4_ = auVar96._0_4_ * auVar70._0_4_;
  auVar126._4_4_ = auVar96._4_4_ * auVar70._4_4_;
  auVar126._8_4_ = auVar96._8_4_ * auVar70._8_4_;
  auVar126._12_4_ = auVar96._12_4_ * auVar70._12_4_;
  auVar70 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar107._0_4_ = fVar136 * auVar70._0_4_;
  auVar107._4_4_ = fVar140 * auVar70._4_4_;
  auVar107._8_4_ = fVar142 * auVar70._8_4_;
  auVar107._12_4_ = fVar144 * auVar70._12_4_;
  auVar70 = vsubps_avx(auVar126,auVar107);
  auVar96 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar70 = vdpps_avx(auVar102,auVar96,0x7f);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar108._0_4_ = auVar104._0_4_ * auVar96._0_4_;
  auVar108._4_4_ = auVar104._4_4_ * auVar96._4_4_;
  auVar108._8_4_ = auVar104._8_4_ * auVar96._8_4_;
  auVar108._12_4_ = auVar104._12_4_ * auVar96._12_4_;
  auVar104 = vshufps_avx(auVar70,auVar70,0);
  auVar127._0_4_ = auVar104._0_4_ * auVar102._0_4_;
  auVar127._4_4_ = auVar104._4_4_ * auVar102._4_4_;
  auVar127._8_4_ = auVar104._8_4_ * auVar102._8_4_;
  auVar127._12_4_ = auVar104._12_4_ * auVar102._12_4_;
  auVar113 = vsubps_avx(auVar108,auVar127);
  auVar104 = vrcpss_avx(auVar50,auVar50);
  auVar104 = ZEXT416((uint)((2.0 - fVar56 * auVar104._0_4_) * auVar104._0_4_));
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar70 = ZEXT416((uint)(fVar41 * 1.5 - fVar41 * fVar41 * fVar56 * 0.5 * fVar41));
  auVar70 = vshufps_avx(auVar70,auVar70,0);
  fVar41 = auVar102._0_4_ * auVar70._0_4_;
  fVar56 = auVar102._4_4_ * auVar70._4_4_;
  fVar57 = auVar102._8_4_ * auVar70._8_4_;
  fVar58 = auVar102._12_4_ * auVar70._12_4_;
  auVar145._0_4_ = fVar77 * -0.0 + fVar146 * 0.0 + fVar105 * -0.0 + fVar76;
  auVar145._4_4_ = fVar124 * -0.0 + fVar150 * 0.0 + fVar110 * -0.0 + fVar86;
  auVar145._8_4_ = fVar130 * -0.0 + fVar151 * 0.0 + fVar111 * -0.0 + fVar87;
  auVar145._12_4_ = fVar132 * -0.0 + fVar152 * 0.0 + fVar112 * -0.0 + fVar88;
  auVar96 = vshufps_avx(auVar128,auVar128,0xff);
  auVar102 = vshufps_avx(auVar145,auVar145,0xff);
  local_f8._0_4_ = auVar102._0_4_ * fVar41;
  local_f8._4_4_ = auVar102._4_4_ * fVar56;
  fStack_f0 = auVar102._8_4_ * fVar57;
  fStack_ec = auVar102._12_4_ * fVar58;
  local_138._0_4_ =
       auVar96._0_4_ * fVar41 + auVar102._0_4_ * auVar70._0_4_ * auVar113._0_4_ * auVar104._0_4_;
  local_138._4_4_ =
       auVar96._4_4_ * fVar56 + auVar102._4_4_ * auVar70._4_4_ * auVar113._4_4_ * auVar104._4_4_;
  fStack_130 = auVar96._8_4_ * fVar57 +
               auVar102._8_4_ * auVar70._8_4_ * auVar113._8_4_ * auVar104._8_4_;
  fStack_12c = auVar96._12_4_ * fVar58 +
               auVar102._12_4_ * auVar70._12_4_ * auVar113._12_4_ * auVar104._12_4_;
  auVar147._0_4_ = fVar77 * -0.0 + fVar146 + fVar105 * -0.0 + fVar76 * 0.0;
  auVar147._4_4_ = fVar124 * -0.0 + fVar150 + fVar110 * -0.0 + fVar86 * 0.0;
  auVar147._8_4_ = fVar130 * -0.0 + fVar151 + fVar111 * -0.0 + fVar87 * 0.0;
  auVar147._12_4_ = fVar132 * -0.0 + fVar152 + fVar112 * -0.0 + fVar88 * 0.0;
  local_318 = auVar22._0_4_;
  fStack_314 = auVar22._4_4_;
  fStack_310 = auVar22._8_4_;
  auVar44._0_4_ = local_318 + fVar135 + fVar89 * 0.0 + fVar123 * -0.0;
  auVar44._4_4_ = fStack_314 + fVar139 + fVar98 * 0.0 + fVar129 * -0.0;
  auVar44._8_4_ = fStack_310 + fVar141 + fVar100 * 0.0 + fVar131 * -0.0;
  auVar44._12_4_ = fVar134 + fVar143 + fVar101 * 0.0 + fVar133 * -0.0;
  auVar71._0_4_ = fVar146 * 0.0 + fVar105 * 0.5;
  auVar71._4_4_ = fVar150 * 0.0 + fVar110 * 0.5;
  auVar71._8_4_ = fVar151 * 0.0 + fVar111 * 0.5;
  auVar71._12_4_ = fVar152 * 0.0 + fVar112 * 0.5;
  auVar78._0_4_ = fVar76 * 0.5;
  auVar78._4_4_ = fVar86 * 0.5;
  auVar78._8_4_ = fVar87 * 0.5;
  auVar78._12_4_ = fVar88 * 0.5;
  auVar104 = vsubps_avx(auVar71,auVar78);
  auVar72._0_4_ = fVar77 * 0.0 + auVar104._0_4_;
  auVar72._4_4_ = fVar124 * 0.0 + auVar104._4_4_;
  auVar72._8_4_ = fVar130 * 0.0 + auVar104._8_4_;
  auVar72._12_4_ = fVar132 * 0.0 + auVar104._12_4_;
  auVar96 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar63._0_4_ = auVar44._0_4_ * auVar96._0_4_;
  auVar63._4_4_ = auVar44._4_4_ * auVar96._4_4_;
  auVar63._8_4_ = auVar44._8_4_ * auVar96._8_4_;
  auVar63._12_4_ = auVar44._12_4_ * auVar96._12_4_;
  auVar104 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar45._0_4_ = auVar72._0_4_ * auVar104._0_4_;
  auVar45._4_4_ = auVar72._4_4_ * auVar104._4_4_;
  auVar45._8_4_ = auVar72._8_4_ * auVar104._8_4_;
  auVar45._12_4_ = auVar72._12_4_ * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar63,auVar45);
  auVar102 = vshufps_avx(auVar104,auVar104,0xc9);
  auVar104 = vdpps_avx(auVar102,auVar102,0x7f);
  fVar77 = auVar104._0_4_;
  auVar50 = ZEXT416((uint)fVar77);
  auVar70 = vrsqrtss_avx(auVar50,auVar50);
  fVar124 = auVar70._0_4_;
  auVar90._0_4_ = auVar145._0_4_ + (float)local_f8._0_4_;
  auVar90._4_4_ = auVar145._4_4_ + (float)local_f8._4_4_;
  auVar90._8_4_ = auVar145._8_4_ + fStack_f0;
  auVar90._12_4_ = auVar145._12_4_ + fStack_ec;
  local_258._0_4_ = auVar10._0_4_;
  local_258._4_4_ = auVar10._4_4_;
  fStack_250 = auVar10._8_4_;
  fStack_24c = auVar10._12_4_;
  auVar118._0_4_ = (float)local_258._0_4_ * 0.5 + fVar59;
  auVar118._4_4_ = (float)local_258._4_4_ * 0.5 + fVar67;
  auVar118._8_4_ = fStack_250 * 0.5 + fVar68;
  auVar118._12_4_ = fStack_24c * 0.5 + fVar134 * 0.0;
  auVar137._0_4_ = auVar90._0_4_ + (fVar136 + (float)local_138._0_4_) * 0.33333334;
  auVar137._4_4_ = auVar90._4_4_ + (fVar140 + (float)local_138._4_4_) * 0.33333334;
  auVar137._8_4_ = auVar90._8_4_ + (fVar142 + fStack_130) * 0.33333334;
  auVar137._12_4_ = auVar90._12_4_ + (fVar144 + fStack_12c) * 0.33333334;
  auVar91._0_4_ = fVar89 * 0.5;
  auVar91._4_4_ = fVar98 * 0.5;
  auVar91._8_4_ = fVar100 * 0.5;
  auVar91._12_4_ = fVar101 * 0.5;
  auVar10 = vsubps_avx(auVar118,auVar91);
  auVar70 = vshufps_avx(auVar147,auVar147,0xff);
  auVar113 = ZEXT416((uint)(fVar124 * 1.5 - fVar77 * 0.5 * fVar124 * fVar124 * fVar124));
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar92._0_4_ = fVar123 * 0.0 + auVar10._0_4_;
  auVar92._4_4_ = fVar129 * 0.0 + auVar10._4_4_;
  auVar92._8_4_ = fVar131 * 0.0 + auVar10._8_4_;
  auVar92._12_4_ = fVar133 * 0.0 + auVar10._12_4_;
  fVar124 = auVar102._0_4_ * auVar113._0_4_;
  fVar130 = auVar102._4_4_ * auVar113._4_4_;
  fVar132 = auVar102._8_4_ * auVar113._8_4_;
  fVar134 = auVar102._12_4_ * auVar113._12_4_;
  auVar79._0_4_ = auVar92._0_4_ * auVar96._0_4_;
  auVar79._4_4_ = auVar92._4_4_ * auVar96._4_4_;
  auVar79._8_4_ = auVar92._8_4_ * auVar96._8_4_;
  auVar79._12_4_ = auVar92._12_4_ * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar92,auVar92,0xc9);
  auVar93._0_4_ = auVar72._0_4_ * auVar96._0_4_;
  auVar93._4_4_ = auVar72._4_4_ * auVar96._4_4_;
  auVar93._8_4_ = auVar72._8_4_ * auVar96._8_4_;
  auVar93._12_4_ = auVar72._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar79,auVar93);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar96 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar94._0_4_ = auVar104._0_4_ * auVar96._0_4_;
  auVar94._4_4_ = auVar104._4_4_ * auVar96._4_4_;
  auVar94._8_4_ = auVar104._8_4_ * auVar96._8_4_;
  auVar94._12_4_ = auVar104._12_4_ * auVar96._12_4_;
  auVar104 = vdpps_avx(auVar102,auVar96,0x7f);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar73._0_4_ = auVar104._0_4_ * auVar102._0_4_;
  auVar73._4_4_ = auVar104._4_4_ * auVar102._4_4_;
  auVar73._8_4_ = auVar104._8_4_ * auVar102._8_4_;
  auVar73._12_4_ = auVar104._12_4_ * auVar102._12_4_;
  auVar96 = vshufps_avx(auVar72,auVar72,0xff);
  local_458._0_4_ = auVar70._0_4_ * fVar124;
  local_458._4_4_ = auVar70._4_4_ * fVar130;
  fStack_450 = auVar70._8_4_ * fVar132;
  fStack_44c = auVar70._12_4_ * fVar134;
  auVar102 = vsubps_avx(auVar94,auVar73);
  auVar95._0_4_ = auVar147._0_4_ + (float)local_458._0_4_;
  auVar95._4_4_ = auVar147._4_4_ + (float)local_458._4_4_;
  auVar95._8_4_ = auVar147._8_4_ + fStack_450;
  auVar95._12_4_ = auVar147._12_4_ + fStack_44c;
  auVar104 = vrcpss_avx(auVar50,auVar50);
  auVar104 = ZEXT416((uint)(auVar104._0_4_ * (2.0 - fVar77 * auVar104._0_4_)));
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  local_2f8._0_4_ =
       fVar124 * auVar96._0_4_ + auVar70._0_4_ * auVar113._0_4_ * auVar102._0_4_ * auVar104._0_4_;
  local_2f8._4_4_ =
       fVar130 * auVar96._4_4_ + auVar70._4_4_ * auVar113._4_4_ * auVar102._4_4_ * auVar104._4_4_;
  fStack_2f0 = fVar132 * auVar96._8_4_ +
               auVar70._8_4_ * auVar113._8_4_ * auVar102._8_4_ * auVar104._8_4_;
  fStack_2ec = fVar134 * auVar96._12_4_ +
               auVar70._12_4_ * auVar113._12_4_ * auVar102._12_4_ * auVar104._12_4_;
  auVar46._0_4_ = (auVar72._0_4_ + (float)local_2f8._0_4_) * 0.33333334;
  auVar46._4_4_ = (auVar72._4_4_ + (float)local_2f8._4_4_) * 0.33333334;
  auVar46._8_4_ = (auVar72._8_4_ + fStack_2f0) * 0.33333334;
  auVar46._12_4_ = (auVar72._12_4_ + fStack_2ec) * 0.33333334;
  auVar102 = vsubps_avx(auVar95,auVar46);
  auVar104 = vshufps_avx(auVar102,auVar102,0xaa);
  local_3c8 = (float)bezier_basis0._2788_8_;
  fStack_3c4 = SUB84(bezier_basis0._2788_8_,4);
  fStack_3c0 = (float)bezier_basis0._2796_8_;
  fStack_3bc = SUB84(bezier_basis0._2796_8_,4);
  fStack_3b8 = (float)bezier_basis0._2804_8_;
  fStack_3b4 = SUB84(bezier_basis0._2804_8_,4);
  fStack_3b0 = (float)bezier_basis0._2812_8_;
  fStack_3ac = SUB84(bezier_basis0._2812_8_,4);
  fVar77 = auVar104._0_4_;
  fVar124 = auVar104._4_4_;
  fVar130 = auVar104._8_4_;
  fVar132 = auVar104._12_4_;
  auVar104 = vshufps_avx(auVar95,auVar95,0xaa);
  fVar134 = auVar104._0_4_;
  fVar41 = auVar104._4_4_;
  fVar56 = auVar104._8_4_;
  auVar70 = vshufps_avx(auVar137,auVar137,0xaa);
  local_1f8 = (float)bezier_basis0._1632_8_;
  fStack_1f0 = (float)bezier_basis0._1640_8_;
  fStack_1ec = SUB84(bezier_basis0._1640_8_,4);
  fStack_1e8 = (float)bezier_basis0._1648_8_;
  fStack_1e4 = SUB84(bezier_basis0._1648_8_,4);
  fStack_1e0 = (float)bezier_basis0._1656_8_;
  fVar57 = auVar70._0_4_;
  fVar58 = auVar70._4_4_;
  fVar59 = auVar70._8_4_;
  auVar96 = vshufps_avx(auVar90,auVar90,0xaa);
  local_408 = (float)bezier_basis0._476_8_;
  fStack_404 = SUB84(bezier_basis0._476_8_,4);
  fStack_400 = (float)bezier_basis0._484_8_;
  fStack_3fc = SUB84(bezier_basis0._484_8_,4);
  fStack_3f8 = (float)bezier_basis0._492_8_;
  fStack_3f4 = SUB84(bezier_basis0._492_8_,4);
  fStack_3f0 = (float)bezier_basis0._500_8_;
  fVar67 = auVar96._0_4_;
  fVar68 = auVar96._4_4_;
  fVar76 = auVar96._8_4_;
  auVar80._0_4_ = fVar67 * local_408 + fVar57 * local_1f8 + fVar77 * local_3c8 + fVar134 * local_1a8
  ;
  auVar80._4_4_ =
       fVar68 * fStack_404 + fVar58 * fStack_1f4 + fVar124 * fStack_3c4 + fVar41 * fStack_1a4;
  auVar80._8_4_ =
       fVar76 * fStack_400 + fVar59 * fStack_1f0 + fVar130 * fStack_3c0 + fVar56 * fStack_1a0;
  auVar80._12_4_ =
       auVar96._12_4_ * fStack_3fc +
       auVar70._12_4_ * fStack_1ec + fVar132 * fStack_3bc + auVar104._12_4_ * fStack_19c;
  auVar80._16_4_ =
       fVar67 * fStack_3f8 + fVar57 * fStack_1e8 + fVar77 * fStack_3b8 + fVar134 * fStack_198;
  auVar80._20_4_ =
       fVar68 * fStack_3f4 + fVar58 * fStack_1e4 + fVar124 * fStack_3b4 + fVar41 * fStack_194;
  auVar80._24_4_ =
       fVar76 * fStack_3f0 + fVar59 * fStack_1e0 + fVar130 * fStack_3b0 + fVar56 * fStack_190;
  auVar80._28_4_ = 0;
  fStack_2c8 = (float)bezier_basis0._7428_8_;
  fStack_2c4 = SUB84(bezier_basis0._7428_8_,4);
  fStack_2c0 = (float)bezier_basis0._7436_8_;
  fStack_1c8 = (float)bezier_basis0._8584_8_;
  fStack_1c4 = SUB84(bezier_basis0._8584_8_,4);
  fStack_1c0 = (float)bezier_basis0._8592_8_;
  local_2b8 = (float)bezier_basis0._6256_8_;
  fStack_2b4 = SUB84(bezier_basis0._6256_8_,4);
  fStack_2b0 = (float)bezier_basis0._6264_8_;
  fStack_2ac = SUB84(bezier_basis0._6264_8_,4);
  fStack_2a8 = (float)bezier_basis0._6272_8_;
  fStack_2a4 = SUB84(bezier_basis0._6272_8_,4);
  fStack_2a0 = (float)bezier_basis0._6280_8_;
  fStack_29c = SUB84(bezier_basis0._6280_8_,4);
  auVar64._8_4_ = 0xff800000;
  auVar64._0_8_ = 0xff800000ff800000;
  auVar64._12_4_ = 0xff800000;
  auVar64._16_4_ = 0xff800000;
  auVar64._20_4_ = 0xff800000;
  auVar64._24_4_ = 0xff800000;
  auVar64._28_4_ = 0xff800000;
  auVar64 = vmaxps_avx(auVar64,auVar80);
  local_3e8 = (float)bezier_basis0._5100_8_;
  fStack_3e4 = SUB84(bezier_basis0._5100_8_,4);
  fStack_3e0 = (float)bezier_basis0._5108_8_;
  fStack_3dc = SUB84(bezier_basis0._5108_8_,4);
  fStack_3d8 = (float)bezier_basis0._5116_8_;
  fStack_3d4 = SUB84(bezier_basis0._5116_8_,4);
  fStack_3d0 = (float)bezier_basis0._5124_8_;
  auVar51._0_4_ = fVar67 * local_3e8 + fVar57 * local_2b8 + fVar77 * local_2d8 + fVar134 * local_1d8
  ;
  auVar51._4_4_ =
       fVar68 * fStack_3e4 + fVar58 * fStack_2b4 + fVar124 * fStack_2d4 + fVar41 * fStack_1d4;
  auVar51._8_4_ =
       fVar76 * fStack_3e0 + fVar59 * fStack_2b0 + fVar130 * fStack_2d0 + fVar56 * fStack_1d0;
  auVar51._12_4_ =
       auVar96._12_4_ * fStack_3dc +
       auVar70._12_4_ * fStack_2ac + fVar132 * fStack_2cc + auVar104._12_4_ * fStack_1cc;
  auVar51._16_4_ =
       fVar67 * fStack_3d8 + fVar57 * fStack_2a8 + fVar77 * fStack_2c8 + fVar134 * fStack_1c8;
  auVar51._20_4_ =
       fVar68 * fStack_3d4 + fVar58 * fStack_2a4 + fVar124 * fStack_2c4 + fVar41 * fStack_1c4;
  auVar51._24_4_ =
       fVar76 * fStack_3d0 + fVar59 * fStack_2a0 + fVar130 * fStack_2c0 + fVar56 * fStack_1c0;
  auVar51._28_4_ = fStack_29c + fVar132 + 0.0 + 0.0;
  auVar53 = vblendps_avx(auVar51,ZEXT832(0) << 0x20,1);
  auVar15._4_4_ = auVar53._4_4_ * 0.055555556;
  auVar15._0_4_ = auVar53._0_4_ * 0.055555556;
  auVar15._8_4_ = auVar53._8_4_ * 0.055555556;
  auVar15._12_4_ = auVar53._12_4_ * 0.055555556;
  auVar15._16_4_ = auVar53._16_4_ * 0.055555556;
  auVar15._20_4_ = auVar53._20_4_ * 0.055555556;
  auVar15._24_4_ = auVar53._24_4_ * 0.055555556;
  auVar15._28_4_ = auVar53._28_4_;
  auVar17 = vsubps_avx(auVar80,auVar15);
  auVar53 = vblendps_avx(auVar51,ZEXT832(0) << 0x20,0x80);
  auVar52._0_4_ = auVar80._0_4_ + auVar53._0_4_ * 0.055555556;
  auVar52._4_4_ = auVar80._4_4_ + auVar53._4_4_ * 0.055555556;
  auVar52._8_4_ = auVar80._8_4_ + auVar53._8_4_ * 0.055555556;
  auVar52._12_4_ = auVar80._12_4_ + auVar53._12_4_ * 0.055555556;
  auVar52._16_4_ = auVar80._16_4_ + auVar53._16_4_ * 0.055555556;
  auVar52._20_4_ = auVar80._20_4_ + auVar53._20_4_ * 0.055555556;
  auVar52._24_4_ = auVar80._24_4_ + auVar53._24_4_ * 0.055555556;
  auVar52._28_4_ = auVar53._28_4_ + 0.0;
  auVar53 = vmaxps_avx(auVar17,auVar52);
  auVar64 = vmaxps_avx(auVar64,auVar53);
  auVar104 = vshufps_avx(auVar102,auVar102,0x55);
  auVar70 = vshufps_avx(auVar95,auVar95,0x55);
  fVar77 = auVar104._0_4_;
  fVar130 = auVar104._4_4_;
  fVar134 = auVar104._8_4_;
  fVar56 = auVar104._12_4_;
  fVar124 = auVar70._0_4_;
  fVar132 = auVar70._4_4_;
  fVar41 = auVar70._8_4_;
  fVar57 = auVar70._12_4_;
  auVar104 = vshufps_avx(auVar137,auVar137,0x55);
  fVar58 = auVar104._0_4_;
  fVar59 = auVar104._4_4_;
  fVar67 = auVar104._8_4_;
  auVar70 = vshufps_avx(auVar90,auVar90,0x55);
  fVar68 = auVar70._0_4_;
  fVar76 = auVar70._4_4_;
  fVar86 = auVar70._8_4_;
  auVar115._0_4_ =
       fVar68 * local_408 + fVar58 * local_1f8 + local_1a8 * fVar124 + local_3c8 * fVar77;
  auVar115._4_4_ =
       fVar76 * fStack_404 + fVar59 * fStack_1f4 + fStack_1a4 * fVar132 + fStack_3c4 * fVar130;
  auVar115._8_4_ =
       fVar86 * fStack_400 + fVar67 * fStack_1f0 + fStack_1a0 * fVar41 + fStack_3c0 * fVar134;
  auVar115._12_4_ =
       auVar70._12_4_ * fStack_3fc +
       auVar104._12_4_ * fStack_1ec + fStack_19c * fVar57 + fStack_3bc * fVar56;
  auVar115._16_4_ =
       fVar68 * fStack_3f8 + fVar58 * fStack_1e8 + fStack_198 * fVar124 + fStack_3b8 * fVar77;
  auVar115._20_4_ =
       fVar76 * fStack_3f4 + fVar59 * fStack_1e4 + fStack_194 * fVar132 + fStack_3b4 * fVar130;
  auVar115._24_4_ =
       fVar86 * fStack_3f0 + fVar67 * fStack_1e0 + fStack_190 * fVar41 + fStack_3b0 * fVar134;
  auVar115._28_4_ = fStack_18c + fStack_3ac + 0.0 + 0.0;
  fStack_1bc = SUB84(bezier_basis0._8592_8_,4);
  auVar65._0_4_ = fVar68 * local_3e8 + fVar58 * local_2b8 + local_2d8 * fVar77 + fVar124 * local_1d8
  ;
  auVar65._4_4_ =
       fVar76 * fStack_3e4 + fVar59 * fStack_2b4 + fStack_2d4 * fVar130 + fVar132 * fStack_1d4;
  auVar65._8_4_ =
       fVar86 * fStack_3e0 + fVar67 * fStack_2b0 + fStack_2d0 * fVar134 + fVar41 * fStack_1d0;
  auVar65._12_4_ =
       auVar70._12_4_ * fStack_3dc +
       auVar104._12_4_ * fStack_2ac + fStack_2cc * fVar56 + fVar57 * fStack_1cc;
  auVar65._16_4_ =
       fVar68 * fStack_3d8 + fVar58 * fStack_2a8 + fStack_2c8 * fVar77 + fVar124 * fStack_1c8;
  auVar65._20_4_ =
       fVar76 * fStack_3d4 + fVar59 * fStack_2a4 + fStack_2c4 * fVar130 + fVar132 * fStack_1c4;
  auVar65._24_4_ =
       fVar86 * fStack_3d0 + fVar67 * fStack_2a0 + fStack_2c0 * fVar134 + fVar41 * fStack_1c0;
  auVar65._28_4_ = fVar57 + fVar57 + fVar56 + fVar57;
  auVar53 = vblendps_avx(auVar65,ZEXT832(0) << 0x20,1);
  auVar16._4_4_ = auVar53._4_4_ * 0.055555556;
  auVar16._0_4_ = auVar53._0_4_ * 0.055555556;
  auVar16._8_4_ = auVar53._8_4_ * 0.055555556;
  auVar16._12_4_ = auVar53._12_4_ * 0.055555556;
  auVar16._16_4_ = auVar53._16_4_ * 0.055555556;
  auVar16._20_4_ = auVar53._20_4_ * 0.055555556;
  auVar16._24_4_ = auVar53._24_4_ * 0.055555556;
  auVar16._28_4_ = auVar53._28_4_;
  auVar18 = vsubps_avx(auVar115,auVar16);
  auVar53 = vblendps_avx(auVar65,ZEXT832(0) << 0x20,0x80);
  auVar66._0_4_ = auVar115._0_4_ + auVar53._0_4_ * 0.055555556;
  auVar66._4_4_ = auVar115._4_4_ + auVar53._4_4_ * 0.055555556;
  auVar66._8_4_ = auVar115._8_4_ + auVar53._8_4_ * 0.055555556;
  auVar66._12_4_ = auVar115._12_4_ + auVar53._12_4_ * 0.055555556;
  auVar66._16_4_ = auVar115._16_4_ + auVar53._16_4_ * 0.055555556;
  auVar66._20_4_ = auVar115._20_4_ + auVar53._20_4_ * 0.055555556;
  auVar66._24_4_ = auVar115._24_4_ + auVar53._24_4_ * 0.055555556;
  auVar66._28_4_ = auVar115._28_4_ + auVar53._28_4_;
  auVar148._8_4_ = 0xff800000;
  auVar148._0_8_ = 0xff800000ff800000;
  auVar148._12_4_ = 0xff800000;
  auVar148._16_4_ = 0xff800000;
  auVar148._20_4_ = 0xff800000;
  auVar148._24_4_ = 0xff800000;
  auVar148._28_4_ = 0xff800000;
  auVar53 = vmaxps_avx(auVar148,auVar115);
  auVar15 = vmaxps_avx(auVar18,auVar66);
  auVar16 = vmaxps_avx(auVar53,auVar15);
  auVar70 = vpermilps_avx(auVar102,0);
  auVar104 = vshufps_avx(auVar95,auVar95,0);
  fVar86 = auVar70._0_4_;
  fVar87 = auVar70._4_4_;
  fVar88 = auVar70._8_4_;
  fVar89 = auVar70._12_4_;
  fVar59 = auVar104._0_4_;
  fVar67 = auVar104._4_4_;
  fVar68 = auVar104._8_4_;
  fVar76 = auVar104._12_4_;
  fVar58 = auVar15._28_4_;
  auVar104 = vshufps_avx(auVar137,auVar137,0);
  fVar77 = auVar104._0_4_;
  fVar130 = auVar104._4_4_;
  fVar134 = auVar104._8_4_;
  fVar56 = auVar104._12_4_;
  auVar104 = vpermilps_avx(auVar90,0);
  fVar124 = auVar104._0_4_;
  fVar132 = auVar104._4_4_;
  fVar41 = auVar104._8_4_;
  fVar57 = auVar104._12_4_;
  auVar149._0_4_ =
       local_408 * fVar124 + local_1f8 * fVar77 + fVar86 * local_3c8 + fVar59 * local_1a8;
  auVar149._4_4_ =
       fStack_404 * fVar132 + fStack_1f4 * fVar130 + fVar87 * fStack_3c4 + fVar67 * fStack_1a4;
  auVar149._8_4_ =
       fStack_400 * fVar41 + fStack_1f0 * fVar134 + fVar88 * fStack_3c0 + fVar68 * fStack_1a0;
  auVar149._12_4_ =
       fStack_3fc * fVar57 + fStack_1ec * fVar56 + fVar89 * fStack_3bc + fVar76 * fStack_19c;
  auVar149._16_4_ =
       fStack_3f8 * fVar124 + fStack_1e8 * fVar77 + fVar86 * fStack_3b8 + fVar59 * fStack_198;
  auVar149._20_4_ =
       fStack_3f4 * fVar132 + fStack_1e4 * fVar130 + fVar87 * fStack_3b4 + fVar67 * fStack_194;
  auVar149._24_4_ =
       fStack_3f0 * fVar41 + fStack_1e0 * fVar134 + fVar88 * fStack_3b0 + fVar68 * fStack_190;
  auVar149._28_4_ = fVar58 + fVar58 + auVar16._28_4_ + fVar58;
  auVar97._0_4_ = local_3e8 * fVar124 + fVar77 * local_2b8 + fVar86 * local_2d8 + fVar59 * local_1d8
  ;
  auVar97._4_4_ =
       fStack_3e4 * fVar132 + fVar130 * fStack_2b4 + fVar87 * fStack_2d4 + fVar67 * fStack_1d4;
  auVar97._8_4_ =
       fStack_3e0 * fVar41 + fVar134 * fStack_2b0 + fVar88 * fStack_2d0 + fVar68 * fStack_1d0;
  auVar97._12_4_ =
       fStack_3dc * fVar57 + fVar56 * fStack_2ac + fVar89 * fStack_2cc + fVar76 * fStack_1cc;
  auVar97._16_4_ =
       fStack_3d8 * fVar124 + fVar77 * fStack_2a8 + fVar86 * fStack_2c8 + fVar59 * fStack_1c8;
  auVar97._20_4_ =
       fStack_3d4 * fVar132 + fVar130 * fStack_2a4 + fVar87 * fStack_2c4 + fVar67 * fStack_1c4;
  auVar97._24_4_ =
       fStack_3d0 * fVar41 + fVar134 * fStack_2a0 + fVar88 * fStack_2c0 + fVar68 * fStack_1c0;
  auVar97._28_4_ = fVar57 + fVar56 + fVar89 + fVar76;
  auVar53 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,1);
  auVar19._4_4_ = auVar53._4_4_ * 0.055555556;
  auVar19._0_4_ = auVar53._0_4_ * 0.055555556;
  auVar19._8_4_ = auVar53._8_4_ * 0.055555556;
  auVar19._12_4_ = auVar53._12_4_ * 0.055555556;
  auVar19._16_4_ = auVar53._16_4_ * 0.055555556;
  auVar19._20_4_ = auVar53._20_4_ * 0.055555556;
  auVar19._24_4_ = auVar53._24_4_ * 0.055555556;
  auVar19._28_4_ = auVar53._28_4_;
  auVar19 = vsubps_avx(auVar149,auVar19);
  auVar53 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  auVar109._0_4_ = auVar149._0_4_ + auVar53._0_4_ * 0.055555556;
  auVar109._4_4_ = auVar149._4_4_ + auVar53._4_4_ * 0.055555556;
  auVar109._8_4_ = auVar149._8_4_ + auVar53._8_4_ * 0.055555556;
  auVar109._12_4_ = auVar149._12_4_ + auVar53._12_4_ * 0.055555556;
  auVar109._16_4_ = auVar149._16_4_ + auVar53._16_4_ * 0.055555556;
  auVar109._20_4_ = auVar149._20_4_ + auVar53._20_4_ * 0.055555556;
  auVar109._24_4_ = auVar149._24_4_ + auVar53._24_4_ * 0.055555556;
  auVar109._28_4_ = auVar149._28_4_ + auVar53._28_4_;
  auVar53._8_4_ = 0xff800000;
  auVar53._0_8_ = 0xff800000ff800000;
  auVar53._12_4_ = 0xff800000;
  auVar53._16_4_ = 0xff800000;
  auVar53._20_4_ = 0xff800000;
  auVar53._24_4_ = 0xff800000;
  auVar53._28_4_ = 0xff800000;
  auVar53 = vmaxps_avx(auVar53,auVar149);
  auVar15 = vmaxps_avx(auVar19,auVar109);
  local_218 = vmaxps_avx(auVar53,auVar15);
  auVar53 = vminps_avx(auVar17,auVar52);
  auVar120._8_4_ = 0x7f800000;
  auVar120._0_8_ = 0x7f8000007f800000;
  auVar120._12_4_ = 0x7f800000;
  auVar120._16_4_ = 0x7f800000;
  auVar120._20_4_ = 0x7f800000;
  auVar120._24_4_ = 0x7f800000;
  auVar120._28_4_ = 0x7f800000;
  auVar17 = vminps_avx(auVar120,auVar80);
  local_238 = vminps_avx(auVar17,auVar53);
  auVar53 = vminps_avx(auVar18,auVar66);
  auVar17 = vminps_avx(auVar120,auVar115);
  _local_258 = vminps_avx(auVar17,auVar53);
  auVar53 = vminps_avx(auVar120,auVar149);
  auVar17 = vminps_avx(auVar19,auVar109);
  local_278 = vminps_avx(auVar53,auVar17);
  auVar113 = vsubps_avx(auVar145,_local_f8);
  auVar104 = vshufps_avx(auVar113,auVar113,0);
  auVar70 = vsubps_avx(auVar128,_local_138);
  auVar47._0_4_ = auVar113._0_4_ + auVar70._0_4_ * 0.33333334;
  auVar47._4_4_ = auVar113._4_4_ + auVar70._4_4_ * 0.33333334;
  auVar47._8_4_ = auVar113._8_4_ + auVar70._8_4_ * 0.33333334;
  auVar47._12_4_ = auVar113._12_4_ + auVar70._12_4_ * 0.33333334;
  auVar70 = vshufps_avx(auVar47,auVar47,0);
  auVar128 = vsubps_avx(auVar147,_local_458);
  auVar96 = vsubps_avx(auVar72,_local_2f8);
  auVar48._0_4_ = auVar96._0_4_ * 0.33333334;
  auVar48._4_4_ = auVar96._4_4_ * 0.33333334;
  auVar48._8_4_ = auVar96._8_4_ * 0.33333334;
  auVar48._12_4_ = auVar96._12_4_ * 0.33333334;
  auVar10 = vsubps_avx(auVar128,auVar48);
  auVar96 = vshufps_avx(auVar10,auVar10,0);
  fVar59 = auVar96._0_4_;
  fVar67 = auVar96._4_4_;
  fVar68 = auVar96._8_4_;
  fVar76 = auVar96._12_4_;
  auVar96 = vshufps_avx(auVar128,auVar128,0);
  fVar86 = auVar96._0_4_;
  fVar87 = auVar96._4_4_;
  fVar88 = auVar96._8_4_;
  fVar89 = auVar96._12_4_;
  fVar77 = auVar15._28_4_;
  fVar41 = auVar70._0_4_;
  fVar56 = auVar70._4_4_;
  fVar57 = auVar70._8_4_;
  fVar58 = auVar70._12_4_;
  fVar124 = auVar104._0_4_;
  fVar130 = auVar104._4_4_;
  fVar132 = auVar104._8_4_;
  fVar134 = auVar104._12_4_;
  auVar81._0_4_ = fVar124 * local_408 + fVar41 * local_1f8 + fVar86 * local_1a8 + fVar59 * local_3c8
  ;
  auVar81._4_4_ =
       fVar130 * fStack_404 + fVar56 * fStack_1f4 + fVar87 * fStack_1a4 + fVar67 * fStack_3c4;
  auVar81._8_4_ =
       fVar132 * fStack_400 + fVar57 * fStack_1f0 + fVar88 * fStack_1a0 + fVar68 * fStack_3c0;
  auVar81._12_4_ =
       fVar134 * fStack_3fc + fVar58 * fStack_1ec + fVar89 * fStack_19c + fVar76 * fStack_3bc;
  auVar81._16_4_ =
       fVar124 * fStack_3f8 + fVar41 * fStack_1e8 + fVar86 * fStack_198 + fVar59 * fStack_3b8;
  auVar81._20_4_ =
       fVar130 * fStack_3f4 + fVar56 * fStack_1e4 + fVar87 * fStack_194 + fVar67 * fStack_3b4;
  auVar81._24_4_ =
       fVar132 * fStack_3f0 + fVar57 * fStack_1e0 + fVar88 * fStack_190 + fVar68 * fStack_3b0;
  auVar81._28_4_ = fVar77 + fVar77 + fVar77 + 0.0;
  auVar54._8_4_ = 0xff800000;
  auVar54._0_8_ = 0xff800000ff800000;
  auVar54._12_4_ = 0xff800000;
  auVar54._16_4_ = 0xff800000;
  auVar54._20_4_ = 0xff800000;
  auVar54._24_4_ = 0xff800000;
  auVar54._28_4_ = 0xff800000;
  auVar15 = vmaxps_avx(auVar54,auVar81);
  fStack_3cc = SUB84(bezier_basis0._5124_8_,4);
  auVar74._0_4_ = fVar124 * local_3e8 + fVar59 * local_2d8 + fVar86 * local_1d8 + fVar41 * local_2b8
  ;
  auVar74._4_4_ =
       fVar130 * fStack_3e4 + fVar67 * fStack_2d4 + fVar87 * fStack_1d4 + fVar56 * fStack_2b4;
  auVar74._8_4_ =
       fVar132 * fStack_3e0 + fVar68 * fStack_2d0 + fVar88 * fStack_1d0 + fVar57 * fStack_2b0;
  auVar74._12_4_ =
       fVar134 * fStack_3dc + fVar76 * fStack_2cc + fVar89 * fStack_1cc + fVar58 * fStack_2ac;
  auVar74._16_4_ =
       fVar124 * fStack_3d8 + fVar59 * fStack_2c8 + fVar86 * fStack_1c8 + fVar41 * fStack_2a8;
  auVar74._20_4_ =
       fVar130 * fStack_3d4 + fVar67 * fStack_2c4 + fVar87 * fStack_1c4 + fVar56 * fStack_2a4;
  auVar74._24_4_ =
       fVar132 * fStack_3d0 + fVar68 * fStack_2c0 + fVar88 * fStack_1c0 + fVar57 * fStack_2a0;
  auVar74._28_4_ = fVar134 + fVar76 + fVar89 + fVar58;
  auVar53 = vblendps_avx(auVar74,ZEXT832(0) << 0x20,1);
  auVar17._4_4_ = auVar53._4_4_ * 0.055555556;
  auVar17._0_4_ = auVar53._0_4_ * 0.055555556;
  auVar17._8_4_ = auVar53._8_4_ * 0.055555556;
  auVar17._12_4_ = auVar53._12_4_ * 0.055555556;
  auVar17._16_4_ = auVar53._16_4_ * 0.055555556;
  auVar17._20_4_ = auVar53._20_4_ * 0.055555556;
  auVar17._24_4_ = auVar53._24_4_ * 0.055555556;
  auVar17._28_4_ = auVar53._28_4_;
  auVar17 = vsubps_avx(auVar81,auVar17);
  auVar53 = vblendps_avx(auVar74,ZEXT832(0) << 0x20,0x80);
  auVar75._0_4_ = auVar81._0_4_ + auVar53._0_4_ * 0.055555556;
  auVar75._4_4_ = auVar81._4_4_ + auVar53._4_4_ * 0.055555556;
  auVar75._8_4_ = auVar81._8_4_ + auVar53._8_4_ * 0.055555556;
  auVar75._12_4_ = auVar81._12_4_ + auVar53._12_4_ * 0.055555556;
  auVar75._16_4_ = auVar81._16_4_ + auVar53._16_4_ * 0.055555556;
  auVar75._20_4_ = auVar81._20_4_ + auVar53._20_4_ * 0.055555556;
  auVar75._24_4_ = auVar81._24_4_ + auVar53._24_4_ * 0.055555556;
  auVar75._28_4_ = auVar81._28_4_ + auVar53._28_4_;
  auVar53 = vmaxps_avx(auVar17,auVar75);
  auVar53 = vmaxps_avx(auVar15,auVar53);
  auVar15 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar104 = vmaxps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar70 = vshufps_avx(auVar10,auVar10,0x55);
  auVar96 = vshufps_avx(auVar128,auVar128,0x55);
  fVar77 = auVar70._0_4_;
  fVar124 = auVar70._4_4_;
  fVar130 = auVar70._8_4_;
  fVar132 = auVar70._12_4_;
  fVar134 = auVar96._0_4_;
  fVar41 = auVar96._4_4_;
  fVar56 = auVar96._8_4_;
  auVar70 = vshufps_avx(auVar47,auVar47,0x55);
  fVar57 = auVar70._0_4_;
  fVar58 = auVar70._4_4_;
  fVar59 = auVar70._8_4_;
  auVar102 = vshufps_avx(auVar113,auVar113,0x55);
  fVar67 = auVar102._0_4_;
  fVar68 = auVar102._4_4_;
  fVar76 = auVar102._8_4_;
  fVar87 = auVar102._12_4_;
  auVar121._0_4_ =
       fVar57 * local_1f8 + fVar77 * local_3c8 + fVar134 * local_1a8 + fVar67 * local_408;
  auVar121._4_4_ =
       fVar58 * fStack_1f4 + fVar124 * fStack_3c4 + fVar41 * fStack_1a4 + fVar68 * fStack_404;
  auVar121._8_4_ =
       fVar59 * fStack_1f0 + fVar130 * fStack_3c0 + fVar56 * fStack_1a0 + fVar76 * fStack_400;
  auVar121._12_4_ =
       auVar70._12_4_ * fStack_1ec + fVar132 * fStack_3bc + auVar96._12_4_ * fStack_19c +
       fVar87 * fStack_3fc;
  auVar121._16_4_ =
       fVar57 * fStack_1e8 + fVar77 * fStack_3b8 + fVar134 * fStack_198 + fVar67 * fStack_3f8;
  auVar121._20_4_ =
       fVar58 * fStack_1e4 + fVar124 * fStack_3b4 + fVar41 * fStack_194 + fVar68 * fStack_3f4;
  auVar121._24_4_ =
       fVar59 * fStack_1e0 + fVar130 * fStack_3b0 + fVar56 * fStack_190 + fVar76 * fStack_3f0;
  auVar121._28_4_ = fStack_1bc + fStack_3ac + 0.0 + auVar81._28_4_;
  auVar82._0_4_ = fVar67 * local_3e8 + fVar57 * local_2b8 + fVar134 * local_1d8 + fVar77 * local_2d8
  ;
  auVar82._4_4_ =
       fVar68 * fStack_3e4 + fVar58 * fStack_2b4 + fVar41 * fStack_1d4 + fVar124 * fStack_2d4;
  auVar82._8_4_ =
       fVar76 * fStack_3e0 + fVar59 * fStack_2b0 + fVar56 * fStack_1d0 + fVar130 * fStack_2d0;
  auVar82._12_4_ =
       fVar87 * fStack_3dc +
       auVar70._12_4_ * fStack_2ac + auVar96._12_4_ * fStack_1cc + fVar132 * fStack_2cc;
  auVar82._16_4_ =
       fVar67 * fStack_3d8 + fVar57 * fStack_2a8 + fVar134 * fStack_1c8 + fVar77 * fStack_2c8;
  auVar82._20_4_ =
       fVar68 * fStack_3d4 + fVar58 * fStack_2a4 + fVar41 * fStack_1c4 + fVar124 * fStack_2c4;
  auVar82._24_4_ =
       fVar76 * fStack_3d0 + fVar59 * fStack_2a0 + fVar56 * fStack_1c0 + fVar130 * fStack_2c0;
  auVar82._28_4_ = fVar132 + fVar132 + fVar132 + auVar81._28_4_;
  auVar53 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,1);
  auVar18._4_4_ = auVar53._4_4_ * 0.055555556;
  auVar18._0_4_ = auVar53._0_4_ * 0.055555556;
  auVar18._8_4_ = auVar53._8_4_ * 0.055555556;
  auVar18._12_4_ = auVar53._12_4_ * 0.055555556;
  auVar18._16_4_ = auVar53._16_4_ * 0.055555556;
  auVar18._20_4_ = auVar53._20_4_ * 0.055555556;
  auVar18._24_4_ = auVar53._24_4_ * 0.055555556;
  auVar18._28_4_ = auVar53._28_4_;
  auVar18 = vsubps_avx(auVar121,auVar18);
  auVar53 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  auVar138._0_4_ = auVar121._0_4_ + auVar53._0_4_ * 0.055555556;
  auVar138._4_4_ = auVar121._4_4_ + auVar53._4_4_ * 0.055555556;
  auVar138._8_4_ = auVar121._8_4_ + auVar53._8_4_ * 0.055555556;
  auVar138._12_4_ = auVar121._12_4_ + auVar53._12_4_ * 0.055555556;
  auVar138._16_4_ = auVar121._16_4_ + auVar53._16_4_ * 0.055555556;
  auVar138._20_4_ = auVar121._20_4_ + auVar53._20_4_ * 0.055555556;
  auVar138._24_4_ = auVar121._24_4_ + auVar53._24_4_ * 0.055555556;
  auVar138._28_4_ = auVar121._28_4_ + auVar53._28_4_;
  auVar83._8_4_ = 0xff800000;
  auVar83._0_8_ = 0xff800000ff800000;
  auVar83._12_4_ = 0xff800000;
  auVar83._16_4_ = 0xff800000;
  auVar83._20_4_ = 0xff800000;
  auVar83._24_4_ = 0xff800000;
  auVar83._28_4_ = 0xff800000;
  auVar53 = vmaxps_avx(auVar83,auVar121);
  auVar15 = vmaxps_avx(auVar18,auVar138);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar15 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar70 = vmaxps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar96 = vunpcklps_avx(auVar104,auVar70);
  auVar104 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar70 = vshufps_avx(auVar128,auVar128,0xaa);
  fVar134 = auVar104._0_4_;
  fVar41 = auVar104._4_4_;
  fVar56 = auVar104._8_4_;
  fVar57 = auVar104._12_4_;
  fVar77 = auVar70._0_4_;
  fVar124 = auVar70._4_4_;
  fVar130 = auVar70._8_4_;
  fVar132 = auVar70._12_4_;
  auVar104 = vshufps_avx(auVar47,auVar47,0xaa);
  fVar58 = auVar104._0_4_;
  fVar59 = auVar104._4_4_;
  fVar67 = auVar104._8_4_;
  auVar70 = vshufps_avx(auVar113,auVar113,0xaa);
  fVar68 = auVar70._0_4_;
  fVar76 = auVar70._4_4_;
  fVar86 = auVar70._8_4_;
  auVar116._0_4_ =
       fVar68 * local_408 + fVar58 * local_1f8 + local_1a8 * fVar77 + fVar134 * local_3c8;
  auVar116._4_4_ =
       fVar76 * fStack_404 + fVar59 * fStack_1f4 + fStack_1a4 * fVar124 + fVar41 * fStack_3c4;
  auVar116._8_4_ =
       fVar86 * fStack_400 + fVar67 * fStack_1f0 + fStack_1a0 * fVar130 + fVar56 * fStack_3c0;
  auVar116._12_4_ =
       auVar70._12_4_ * fStack_3fc +
       auVar104._12_4_ * fStack_1ec + fStack_19c * fVar132 + fVar57 * fStack_3bc;
  auVar116._16_4_ =
       fVar68 * fStack_3f8 + fVar58 * fStack_1e8 + fStack_198 * fVar77 + fVar134 * fStack_3b8;
  auVar116._20_4_ =
       fVar76 * fStack_3f4 + fVar59 * fStack_1e4 + fStack_194 * fVar124 + fVar41 * fStack_3b4;
  auVar116._24_4_ =
       fVar86 * fStack_3f0 + fVar67 * fStack_1e0 + fStack_190 * fVar130 + fVar56 * fStack_3b0;
  auVar116._28_4_ = fVar87 + fStack_3cc + 0.0 + 0.0;
  auVar84._0_4_ = fVar68 * local_3e8 + fVar58 * local_2b8 + fVar134 * local_2d8 + fVar77 * local_1d8
  ;
  auVar84._4_4_ =
       fVar76 * fStack_3e4 + fVar59 * fStack_2b4 + fVar41 * fStack_2d4 + fVar124 * fStack_1d4;
  auVar84._8_4_ =
       fVar86 * fStack_3e0 + fVar67 * fStack_2b0 + fVar56 * fStack_2d0 + fVar130 * fStack_1d0;
  auVar84._12_4_ =
       auVar70._12_4_ * fStack_3dc +
       auVar104._12_4_ * fStack_2ac + fVar57 * fStack_2cc + fVar132 * fStack_1cc;
  auVar84._16_4_ =
       fVar68 * fStack_3d8 + fVar58 * fStack_2a8 + fVar134 * fStack_2c8 + fVar77 * fStack_1c8;
  auVar84._20_4_ =
       fVar76 * fStack_3d4 + fVar59 * fStack_2a4 + fVar41 * fStack_2c4 + fVar124 * fStack_1c4;
  auVar84._24_4_ =
       fVar86 * fStack_3d0 + fVar67 * fStack_2a0 + fVar56 * fStack_2c0 + fVar130 * fStack_1c0;
  auVar84._28_4_ = fVar132 + fVar132 + fVar57 + fVar132;
  auVar53 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,1);
  auVar20._4_4_ = auVar53._4_4_ * 0.055555556;
  auVar20._0_4_ = auVar53._0_4_ * 0.055555556;
  auVar20._8_4_ = auVar53._8_4_ * 0.055555556;
  auVar20._12_4_ = auVar53._12_4_ * 0.055555556;
  auVar20._16_4_ = auVar53._16_4_ * 0.055555556;
  auVar20._20_4_ = auVar53._20_4_ * 0.055555556;
  auVar20._24_4_ = auVar53._24_4_ * 0.055555556;
  auVar20._28_4_ = auVar53._28_4_;
  auVar19 = vsubps_avx(auVar116,auVar20);
  auVar53 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,0x80);
  auVar153._0_4_ = auVar116._0_4_ + auVar53._0_4_ * 0.055555556;
  auVar153._4_4_ = auVar116._4_4_ + auVar53._4_4_ * 0.055555556;
  auVar153._8_4_ = auVar116._8_4_ + auVar53._8_4_ * 0.055555556;
  auVar153._12_4_ = auVar116._12_4_ + auVar53._12_4_ * 0.055555556;
  auVar153._16_4_ = auVar116._16_4_ + auVar53._16_4_ * 0.055555556;
  auVar153._20_4_ = auVar116._20_4_ + auVar53._20_4_ * 0.055555556;
  auVar153._24_4_ = auVar116._24_4_ + auVar53._24_4_ * 0.055555556;
  auVar153._28_4_ = auVar116._28_4_ + auVar53._28_4_;
  auVar55._8_4_ = 0xff800000;
  auVar55._0_8_ = 0xff800000ff800000;
  auVar55._12_4_ = 0xff800000;
  auVar55._16_4_ = 0xff800000;
  auVar55._20_4_ = 0xff800000;
  auVar55._24_4_ = 0xff800000;
  auVar55._28_4_ = 0xff800000;
  auVar53 = vmaxps_avx(auVar55,auVar116);
  auVar15 = vmaxps_avx(auVar19,auVar153);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar15 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar104 = vmaxps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar104 = vinsertps_avx(auVar96,auVar104,0x28);
  auVar53 = vminps_avx(auVar17,auVar75);
  auVar85._8_4_ = 0x7f800000;
  auVar85._0_8_ = 0x7f8000007f800000;
  auVar85._12_4_ = 0x7f800000;
  auVar85._16_4_ = 0x7f800000;
  auVar85._20_4_ = 0x7f800000;
  auVar85._24_4_ = 0x7f800000;
  auVar85._28_4_ = 0x7f800000;
  auVar15 = vminps_avx(auVar85,auVar81);
  auVar53 = vminps_avx(auVar15,auVar53);
  auVar15 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vminps_avx(auVar53,auVar15);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vminps_avx(auVar53,auVar15);
  auVar70 = vminps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar53 = vminps_avx(auVar18,auVar138);
  auVar15 = vminps_avx(auVar85,auVar121);
  auVar119._8_4_ = 0xddccb9a2;
  auVar119._0_8_ = 0xddccb9a2ddccb9a2;
  auVar119._12_4_ = 0xddccb9a2;
  auVar122 = ZEXT1664(auVar119);
  auVar53 = vminps_avx(auVar15,auVar53);
  auVar15 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vminps_avx(auVar53,auVar15);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vminps_avx(auVar53,auVar15);
  auVar96 = vminps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar96 = vunpcklps_avx(auVar70,auVar96);
  auVar53 = vminps_avx(auVar19,auVar153);
  auVar15 = vminps_avx(auVar85,auVar116);
  auVar114._8_4_ = 0x5dccb9a2;
  auVar114._0_8_ = 0x5dccb9a25dccb9a2;
  auVar114._12_4_ = 0x5dccb9a2;
  auVar117 = ZEXT1664(auVar114);
  auVar53 = vminps_avx(auVar15,auVar53);
  auVar15 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vminps_avx(auVar53,auVar15);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vminps_avx(auVar53,auVar15);
  auVar70 = vminps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar70 = vinsertps_avx(auVar96,auVar70,0x28);
  auVar53 = vshufps_avx(local_278,local_278,0xb1);
  auVar53 = vminps_avx(local_278,auVar53);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vminps_avx(auVar53,auVar15);
  auVar96 = vminps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar53 = vshufps_avx(_local_258,_local_258,0xb1);
  auVar53 = vminps_avx(_local_258,auVar53);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vminps_avx(auVar53,auVar15);
  auVar102 = vminps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar102 = vunpcklps_avx(auVar96,auVar102);
  auVar53 = vshufps_avx(local_238,local_238,0xb1);
  auVar53 = vminps_avx(local_238,auVar53);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vminps_avx(auVar53,auVar15);
  auVar96 = vminps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar96 = vinsertps_avx(auVar102,auVar96,0x28);
  auVar102 = vminps_avx(auVar70,auVar96);
  auVar53 = vshufps_avx(local_218,local_218,0xb1);
  auVar53 = vmaxps_avx(local_218,auVar53);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar70 = vmaxps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar53 = vshufps_avx(auVar16,auVar16,0xb1);
  auVar53 = vmaxps_avx(auVar16,auVar53);
  auVar15 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vmaxps_avx(auVar53,auVar15);
  auVar96 = vmaxps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar96 = vunpcklps_avx(auVar70,auVar96);
  auVar53 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar53 = vmaxps_avx(auVar64,auVar53);
  auVar64 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vmaxps_avx(auVar53,auVar64);
  auVar70 = vmaxps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar70 = vinsertps_avx(auVar96,auVar70,0x28);
  auVar70 = vmaxps_avx(auVar104,auVar70);
  auVar104 = vcmpps_avx(auVar102,auVar119,6);
  auVar70 = vcmpps_avx(auVar70,auVar114,1);
  auVar104 = vandps_avx(auVar70,auVar104);
  uVar39 = vmovmskps_avx(auVar104);
  lVar34 = lVar34 + 0x38;
  if ((~(byte)uVar39 & 7) != 0) goto LAB_00bea770;
  goto LAB_00be9986;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }